

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_transaction.cpp
# Opt level: O2

void __thiscall duckdb::MetaTransaction::ModifyDatabase(MetaTransaction *this,AttachedDatabase *db)

{
  bool bVar1;
  Transaction *pTVar2;
  TransactionException *pTVar3;
  AttachedDatabase *pAVar4;
  allocator local_a1;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = AttachedDatabase::IsSystem(db);
  if (!bVar1) {
    bVar1 = AttachedDatabase::IsTemporary(db);
    if (!bVar1) {
      if (this->is_read_only == true) {
        pTVar3 = (TransactionException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_a0,
                   "Cannot write to database \"%s\" - transaction is launched in read-only mode",
                   &local_a1);
        ::std::__cxx11::string::string((string *)&local_40,(string *)&(db->super_CatalogEntry).name)
        ;
        TransactionException::TransactionException<std::__cxx11::string>(pTVar3,&local_a0,&local_40)
        ;
        __cxa_throw(pTVar3,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pAVar4 = (this->modified_database).ptr;
      if (pAVar4 == (AttachedDatabase *)0x0) {
        (this->modified_database).ptr = db;
        pTVar2 = GetTransaction(this,db);
        (*pTVar2->_vptr_Transaction[2])(pTVar2);
        return;
      }
      if (pAVar4 != db) {
        pTVar3 = (TransactionException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_a0,
                   "Attempting to write to database \"%s\" in a transaction that has already modified database \"%s\" - a single transaction can only write to a single attached database."
                   ,&local_a1);
        ::std::__cxx11::string::string((string *)&local_60,(string *)&(db->super_CatalogEntry).name)
        ;
        pAVar4 = optional_ptr<duckdb::AttachedDatabase,_true>::operator->(&this->modified_database);
        ::std::__cxx11::string::string
                  ((string *)&local_80,(string *)&(pAVar4->super_CatalogEntry).name);
        TransactionException::TransactionException<std::__cxx11::string,std::__cxx11::string>
                  (pTVar3,&local_a0,&local_60,&local_80);
        __cxa_throw(pTVar3,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  return;
}

Assistant:

void MetaTransaction::ModifyDatabase(AttachedDatabase &db) {
	if (db.IsSystem() || db.IsTemporary()) {
		// we can always modify the system and temp databases
		return;
	}
	if (IsReadOnly()) {
		throw TransactionException("Cannot write to database \"%s\" - transaction is launched in read-only mode",
		                           db.GetName());
	}
	if (!modified_database) {
		modified_database = &db;

		auto &transaction = GetTransaction(db);
		transaction.SetReadWrite();
		return;
	}
	if (&db != modified_database.get()) {
		throw TransactionException(
		    "Attempting to write to database \"%s\" in a transaction that has already modified database \"%s\" - a "
		    "single transaction can only write to a single attached database.",
		    db.GetName(), modified_database->GetName());
	}
}